

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_until.hpp
# Opt level: O2

pair<asio::buffers_iterator<asio::const_buffers_1,_char>,_bool> * __thiscall
asio::detail::
partial_search<asio::buffers_iterator<asio::const_buffers_1,char>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (pair<asio::buffers_iterator<asio::const_buffers_1,_char>,_bool> *__return_storage_ptr__,
          detail *this,buffers_iterator<asio::const_buffers_1,_char> first1,
          buffers_iterator<asio::const_buffers_1,_char> last1,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first2,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 last2)

{
  bool bVar1;
  long lVar2;
  buffers_iterator<asio::const_buffers_1,_char> local_a8;
  buffers_iterator<asio::const_buffers_1,_char> local_68;
  
  local_a8.position_ = first1.position_;
  local_a8.current_ = first1.current_;
  local_a8.end_ = first1.end_;
  local_a8.current_buffer_position_ = first1.current_buffer_position_;
  local_a8.begin_ = first1.begin_;
  local_a8.current_buffer_.data_ = first1.current_buffer_.data_;
  local_a8.current_buffer_.size_ = first1.current_buffer_.size_;
  do {
    if (local_a8.position_ == last1.position_) {
      (__return_storage_ptr__->first).position_ = last1.position_;
      (__return_storage_ptr__->first).current_ = last1.current_;
      (__return_storage_ptr__->first).end_ = last1.end_;
      (__return_storage_ptr__->first).current_buffer_position_ = last1.current_buffer_position_;
      (__return_storage_ptr__->first).begin_ = last1.begin_;
      (__return_storage_ptr__->first).current_buffer_.data_ = last1.current_buffer_.data_;
      (__return_storage_ptr__->first).current_buffer_.size_ = last1.current_buffer_.size_;
      __return_storage_ptr__->second = false;
      return __return_storage_ptr__;
    }
    local_68.position_ = local_a8.position_;
    local_68.current_ = local_a8.current_;
    local_68.end_ = local_a8.end_;
    local_68.current_buffer_position_ = local_a8.current_buffer_position_;
    local_68.begin_ = local_a8.begin_;
    local_68.current_buffer_.data_ = local_a8.current_buffer_.data_;
    local_68.current_buffer_.size_ = local_a8.current_buffer_.size_;
    lVar2 = 0;
LAB_0011dd6d:
    if (this + lVar2 == (detail *)first2._M_current) {
      bVar1 = true;
LAB_0011ddac:
      (__return_storage_ptr__->first).position_ = local_a8.position_;
      (__return_storage_ptr__->first).current_ = local_a8.current_;
      (__return_storage_ptr__->first).end_ = local_a8.end_;
      (__return_storage_ptr__->first).current_buffer_position_ = local_a8.current_buffer_position_;
      (__return_storage_ptr__->first).begin_ = local_a8.begin_;
      (__return_storage_ptr__->first).current_buffer_.data_ = local_a8.current_buffer_.data_;
      (__return_storage_ptr__->first).current_buffer_.size_ = local_a8.current_buffer_.size_;
      __return_storage_ptr__->second = bVar1;
      return __return_storage_ptr__;
    }
    if (local_68.position_ != last1.position_) {
      if (*(detail *)((long)local_68.current_buffer_.data_ + local_68.current_buffer_position_) !=
          this[lVar2]) goto LAB_0011dda0;
      buffers_iterator<asio::const_buffers_1,_char>::increment(&local_68);
      lVar2 = lVar2 + 1;
      goto LAB_0011dd6d;
    }
    if (lVar2 != 0) {
      bVar1 = false;
      goto LAB_0011ddac;
    }
LAB_0011dda0:
    buffers_iterator<asio::const_buffers_1,_char>::increment(&local_a8);
  } while( true );
}

Assistant:

std::pair<Iterator1, bool> partial_search(
      Iterator1 first1, Iterator1 last1, Iterator2 first2, Iterator2 last2)
  {
    for (Iterator1 iter1 = first1; iter1 != last1; ++iter1)
    {
      Iterator1 test_iter1 = iter1;
      Iterator2 test_iter2 = first2;
      for (;; ++test_iter1, ++test_iter2)
      {
        if (test_iter2 == last2)
          return std::make_pair(iter1, true);
        if (test_iter1 == last1)
        {
          if (test_iter2 != first2)
            return std::make_pair(iter1, false);
          else
            break;
        }
        if (*test_iter1 != *test_iter2)
          break;
      }
    }
    return std::make_pair(last1, false);
  }